

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options)

{
  pointer ppFVar1;
  DescriptorBuilder *this_00;
  FieldDescriptor *innermost_field;
  Message *pMVar2;
  scoped_ptr<google::protobuf::UnknownFieldSet> p;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  Type TVar6;
  Type *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *pLVar8;
  anon_union_8_8_13f84498_for_Symbol_2 aVar9;
  anon_union_8_8_13f84498_for_Symbol_2 this_01;
  undefined4 extraout_var_01;
  UnknownFieldSet *pUVar10;
  string *psVar11;
  UnknownFieldSet *pUVar12;
  undefined4 extraout_var_02;
  anon_union_8_8_13f84498_for_Symbol_2 this_02;
  CodedOutputStream *this_03;
  pointer ppFVar13;
  Symbol SVar14;
  FieldDescriptor *field;
  Message *local_168;
  CodedOutputStream out;
  LogMessage local_140;
  string debug_msg_name;
  scoped_ptr<google::protobuf::UnknownFieldSet> unknown_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  scoped_ptr<google::protobuf::UnknownFieldSet> parent_unknown_fields;
  StringOutputStream outstr;
  CodedOutputStream local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168 = options;
  if ((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"Option must have a name.",(allocator<char> *)&debug_msg_name);
    bVar3 = AddNameError(this,(string *)&local_140);
LAB_002ebc7a:
    std::__cxx11::string::~string((string *)&local_140);
    return bVar3;
  }
  pTVar7 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                     (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,0);
  bVar3 = std::operator==((pTVar7->name_part_).ptr_,"uninterpreted_option");
  pMVar2 = local_168;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"Option must not use reserved name \"uninterpreted_option\".",
               (allocator<char> *)&debug_msg_name);
    bVar3 = AddNameError(this,(string *)&local_140);
    goto LAB_002ebc7a;
  }
  this_00 = this->builder_;
  iVar4 = (*(local_168->super_MessageLite)._vptr_MessageLite[0x17])(local_168);
  SVar14 = FindSymbolNotEnforcingDeps(this_00,*(string **)(CONCAT44(extraout_var,iVar4) + 8),true);
  this_01 = SVar14.field_1;
  if (SVar14.type != MESSAGE) {
    this_01._0_4_ = (*(pMVar2->super_MessageLite)._vptr_MessageLite[0x17])(pMVar2);
    this_01._4_4_ = extraout_var_00;
  }
  if ((DescriptorBuilder *)this_01.descriptor == (DescriptorBuilder *)0x0) {
    internal::LogMessage::LogMessage
              (&local_140,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1797);
    pLVar8 = internal::LogMessage::operator<<(&local_140,"CHECK failed: options_descriptor: ");
    internal::LogFinisher::operator=((LogFinisher *)&debug_msg_name,pLVar8);
    internal::LogMessage::~LogMessage(&local_140);
  }
  field = (FieldDescriptor *)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  intermediate_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debug_msg_name,"",(allocator<char> *)&local_140);
  for (iVar4 = 0;
      ppFVar1 = intermediate_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      ppFVar13 = intermediate_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start, innermost_field = field,
      iVar4 < (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = iVar4 + 1) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                       (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,iVar4);
    psVar11 = (pTVar7->name_part_).ptr_;
    if (debug_msg_name._M_string_length != 0) {
      std::__cxx11::string::append((char *)&debug_msg_name);
    }
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                       (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,iVar4);
    if (pTVar7->is_extension_ == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,"(",
                     psVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,")")
      ;
      std::__cxx11::string::append((string *)&debug_msg_name);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&out);
      this_02 = (anon_union_8_8_13f84498_for_Symbol_2)this->builder_;
      SVar14 = LookupSymbol((DescriptorBuilder *)this_02.descriptor,psVar11,
                            &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,LOOKUP_ALL,
                            true);
      aVar9 = SVar14.field_1;
      if (SVar14.type != FIELD) {
        aVar9.field_descriptor = field;
      }
    }
    else {
      std::__cxx11::string::append((string *)&debug_msg_name);
      this_02 = this_01;
      aVar9.field_descriptor = Descriptor::FindFieldByName(this_01.descriptor,psVar11);
    }
    field = aVar9.field_descriptor;
    if (field == (FieldDescriptor *)0x0) {
      if (this->builder_->pool_->allow_unknown_ == true) {
LAB_002ec1d6:
        bVar3 = true;
        AddWithoutInterpreting
                  ((OptionInterpreter *)this_02.descriptor,this->uninterpreted_option_,local_168);
      }
      else {
        if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         "Option \"",&debug_msg_name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                         "\" unknown.");
          bVar3 = AddNameError(this,(string *)&local_140);
          goto LAB_002ec37b;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70,"Option \"",&debug_msg_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parent_unknown_fields,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70,"\" is resolved to \"(");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &unknown_fields,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parent_unknown_fields,&this->builder_->undefine_resolved_name_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &unknown_fields,
                       ")\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(."
                      );
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&debug_msg_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstr,
                       &local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       "\") to start from the outermost scope.");
        bVar3 = AddNameError(this,(string *)&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&out);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&outstr);
        std::__cxx11::string::~string((string *)&unknown_fields);
        std::__cxx11::string::~string((string *)&parent_unknown_fields);
        this_03 = &local_70;
LAB_002ec38c:
        std::__cxx11::string::~string((string *)this_03);
      }
      goto LAB_002ec406;
    }
    if (*(DescriptorBuilder **)(field + 0x58) != (DescriptorBuilder *)this_01.descriptor) {
      if (*(char *)&((*(DescriptorBuilder **)(field + 0x58))->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != '\0') goto LAB_002ec1d6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &unknown_fields,"Option field \"",&debug_msg_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &unknown_fields,"\" is not a field or extension of message \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstr,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      this_01.descriptor);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     "\".");
      bVar3 = AddNameError(this,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&outstr);
      this_03 = (CodedOutputStream *)&unknown_fields;
      goto LAB_002ec38c;
    }
    if (iVar4 < (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_ + -1)
    {
      CVar5 = FieldDescriptor::cpp_type(field);
      if (CVar5 == CPPTYPE_MESSAGE) {
        if (*(int *)(field + 0x4c) != 3) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back(&intermediate_fields,&field);
          this_01.descriptor = FieldDescriptor::message_type(field);
          goto LAB_002ebe81;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       "Option field \"",&debug_msg_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       "\" is a repeated message. Repeated message options must be initialized using an aggregate value."
                      );
        bVar3 = AddNameError(this,(string *)&local_140);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       "Option \"",&debug_msg_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       "\" is an atomic type, not a message.");
        bVar3 = AddNameError(this,(string *)&local_140);
      }
LAB_002ec37b:
      std::__cxx11::string::~string((string *)&local_140);
      this_03 = &out;
      goto LAB_002ec38c;
    }
LAB_002ebe81:
  }
  if (*(int *)(field + 0x4c) != 3) {
    iVar4 = (*(local_168->super_MessageLite)._vptr_MessageLite[0x16])();
    pUVar10 = (UnknownFieldSet *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x10))
                        ((long *)CONCAT44(extraout_var_01,iVar4),local_168);
    bVar3 = ExamineIfOptionIsSet
                      (this,(const_iterator)ppFVar13,(const_iterator)ppFVar1,innermost_field,
                       &debug_msg_name,pUVar10);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_002ec406;
    }
  }
  unknown_fields.ptr_ = (UnknownFieldSet *)operator_new(8);
  (unknown_fields.ptr_)->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  bVar3 = SetOptionValue(this,field,unknown_fields.ptr_);
  if (bVar3) {
    ppFVar13 = intermediate_fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    while (pMVar2 = local_168,
          ppFVar13 !=
          intermediate_fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
      parent_unknown_fields.ptr_ = (UnknownFieldSet *)operator_new(8);
      (parent_unknown_fields.ptr_)->fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
      TVar6 = FieldDescriptor::type(ppFVar13[-1]);
      ppFVar1 = ppFVar13 + -1;
      if (TVar6 == TYPE_GROUP) {
        pUVar10 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator->
                            (&parent_unknown_fields);
        pUVar10 = UnknownFieldSet::AddGroup(pUVar10,*(int *)(*ppFVar1 + 0x38));
        pUVar12 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*
                            (&unknown_fields);
        UnknownFieldSet::MergeFrom(pUVar10,pUVar12);
      }
      else {
        if (TVar6 != TYPE_MESSAGE) {
          internal::LogMessage::LogMessage
                    (&local_140,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1825);
          pLVar8 = internal::LogMessage::operator<<
                             (&local_140,"Invalid wire type for CPPTYPE_MESSAGE: ");
          TVar6 = FieldDescriptor::type(ppFVar13[-1]);
          pLVar8 = internal::LogMessage::operator<<(pLVar8,TVar6);
          internal::LogFinisher::operator=((LogFinisher *)&out,pLVar8);
          internal::LogMessage::~LogMessage(&local_140);
          internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr
                    (&parent_unknown_fields);
          goto LAB_002ec3f7;
        }
        pUVar10 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator->
                            (&parent_unknown_fields);
        psVar11 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar10,*(int *)(*ppFVar1 + 0x38));
        io::StringOutputStream::StringOutputStream(&outstr,psVar11);
        io::CodedOutputStream::CodedOutputStream(&out,&outstr.super_ZeroCopyOutputStream);
        pUVar10 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*
                            (&unknown_fields);
        internal::WireFormat::SerializeUnknownFields(pUVar10,&out);
        if (out.had_error_ == true) {
          internal::LogMessage::LogMessage
                    (&local_140,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1818);
          pLVar8 = internal::LogMessage::operator<<(&local_140,"CHECK failed: !out.HadError(): ");
          pLVar8 = internal::LogMessage::operator<<
                             (pLVar8,"Unexpected failure while serializing option submessage ");
          pLVar8 = internal::LogMessage::operator<<(pLVar8,&debug_msg_name);
          pLVar8 = internal::LogMessage::operator<<(pLVar8,"\".");
          internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar8);
          internal::LogMessage::~LogMessage(&local_140);
        }
        io::CodedOutputStream::~CodedOutputStream(&out);
        io::StringOutputStream::~StringOutputStream(&outstr);
      }
      p.ptr_ = parent_unknown_fields.ptr_;
      parent_unknown_fields.ptr_ = (UnknownFieldSet *)0x0;
      internal::scoped_ptr<google::protobuf::UnknownFieldSet>::reset(&unknown_fields,p.ptr_);
      internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&parent_unknown_fields);
      ppFVar13 = ppFVar1;
    }
    iVar4 = (*(local_168->super_MessageLite)._vptr_MessageLite[0x16])(local_168);
    pUVar10 = (UnknownFieldSet *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x18))
                        ((long *)CONCAT44(extraout_var_02,iVar4),pMVar2);
    pUVar12 = internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*(&unknown_fields);
    bVar3 = true;
    UnknownFieldSet::MergeFrom(pUVar10,pUVar12);
  }
  else {
LAB_002ec3f7:
    bVar3 = false;
  }
  internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&unknown_fields);
LAB_002ec406:
  std::__cxx11::string::~string((string *)&debug_msg_name);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&intermediate_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return bVar3;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError("Option must not use reserved name "
                        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = NULL;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the
  // file we're currently building. The descriptor should be there as long as
  // the file we're building imported "google/protobuf/descriptors.proto".

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
    options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = NULL;
  std::vector<const FieldDescriptor*> intermediate_fields;
  string debug_msg_name = "";

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol = builder_->LookupSymbol(name_part,
                                      options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == NULL) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError("Option \"" + debug_msg_name + "\" unknown.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else if (i < uninterpreted_option_->name_size() - 1) {
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        return AddNameError("Option \"" +  debug_msg_name +
                            "\" is an atomic type, not a message.");
      } else if (field->is_repeated()) {
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is a repeated message. Repeated message "
                            "options must be initialized using an "
                            "aggregate value.");
      } else {
        // Drill down into the submessage.
        intermediate_fields.push_back(field);
        descriptor = field->message_type();
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() && !ExamineIfOptionIsSet(
          intermediate_fields.begin(),
          intermediate_fields.end(),
          field, debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }


  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  google::protobuf::scoped_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    google::protobuf::scoped_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
         parent_unknown_fields->AddGroup((*iter)->number())
                              ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  return true;
}